

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_export.cpp
# Opt level: O0

unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
__thiscall duckdb::PhysicalExport::GetGlobalSourceState(PhysicalExport *this,ClientContext *context)

{
  __uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_> in_RDI
  ;
  unique_ptr<duckdb::ExportSourceState,_std::default_delete<duckdb::ExportSourceState>_>
  *in_stack_ffffffffffffffc8;
  __uniq_ptr_impl<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>
  this_00;
  
  this_00._M_t.
  super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
  .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl =
       in_RDI._M_t.
       super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
       .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
  make_uniq<duckdb::ExportSourceState>();
  unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>,true>::
  unique_ptr<duckdb::ExportSourceState,std::default_delete<std::unique_ptr<duckdb::GlobalSourceState,std::default_delete<duckdb::GlobalSourceState>>>,void>
            ((unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>,_true>
              *)this_00._M_t.
                super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
                .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl,
             in_stack_ffffffffffffffc8);
  unique_ptr<duckdb::ExportSourceState,_std::default_delete<duckdb::ExportSourceState>,_true>::
  ~unique_ptr((unique_ptr<duckdb::ExportSourceState,_std::default_delete<duckdb::ExportSourceState>,_true>
               *)0x186a6a3);
  return (unique_ptr<duckdb::GlobalSourceState,_std::default_delete<duckdb::GlobalSourceState>_>)
         (_Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
          )in_RDI._M_t.
           super__Tuple_impl<0UL,_duckdb::GlobalSourceState_*,_std::default_delete<duckdb::GlobalSourceState>_>
           .super__Head_base<0UL,_duckdb::GlobalSourceState_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<GlobalSourceState> PhysicalExport::GetGlobalSourceState(ClientContext &context) const {
	return make_uniq<ExportSourceState>();
}